

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleAverageVerifier::verify
          (SampleAverageVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  float fVar1;
  int i;
  long lVar2;
  float fVar3;
  Vec2 distanceFromCenter;
  Vector<float,_2> res;
  Vec2 avgPosition;
  undefined1 *local_8;
  
  avgPosition.m_data[0] = (float)(*(uint *)ctx >> 8 & 0xff) / 255.0;
  avgPosition.m_data[1] = (float)(*(uint *)ctx >> 0x10 & 0xff) / 255.0;
  local_8 = &DAT_3f0000003f000000;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = avgPosition.m_data[lVar2] - *(float *)((long)&local_8 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  distanceFromCenter.m_data[0] = 0.0;
  distanceFromCenter.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    fVar1 = res.m_data[lVar2];
    fVar3 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar3 = fVar1;
    }
    distanceFromCenter.m_data[lVar2] = fVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return -(uint)(distanceFromCenter.m_data[0] < this->m_distanceThreshold &&
                distanceFromCenter.m_data[1] < this->m_distanceThreshold) & 0xffffff01;
}

Assistant:

int			getBlue					(void) const { return (int)((m_value >> (deUint32)BLUE_SHIFT)  & 0xFFu); }